

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_serializer.cxx
# Opt level: O1

string * __thiscall
nuraft::buffer_serializer::get_str_abi_cxx11_
          (string *__return_storage_ptr__,buffer_serializer *this)

{
  void *pvVar1;
  size_t len;
  size_t local_10;
  
  local_10 = 0;
  pvVar1 = get_bytes(this,&local_10);
  if (pvVar1 == (void *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pvVar1,local_10 + (long)pvVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string buffer_serializer::get_str() {
    size_t len = 0;
    void* data = get_bytes(len);
    if (!data) return std::string();
    return std::string((const char*)data, len);
}